

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O1

UINT8 __thiscall S98Player::UnloadFile(S98Player *this)

{
  pointer pSVar1;
  UINT8 UVar2;
  
  UVar2 = 0xff;
  if ((this->_playState & 1) == 0) {
    this->_playState = '\0';
    this->_dLoad = (DATA_LOADER *)0x0;
    this->_fileData = (UINT8 *)0x0;
    (this->_fileHdr).fileVer = 0xff;
    (this->_fileHdr).dataOfs = 0;
    pSVar1 = (this->_devHdrs).super__Vector_base<S98_DEVICE,_std::allocator<S98_DEVICE>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->_devHdrs).super__Vector_base<S98_DEVICE,_std::allocator<S98_DEVICE>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar1) {
      (this->_devHdrs).super__Vector_base<S98_DEVICE,_std::allocator<S98_DEVICE>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar1;
    }
    std::vector<S98Player::S98_CHIPDEV,_std::allocator<S98Player::S98_CHIPDEV>_>::_M_erase_at_end
              (&this->_devices,
               (this->_devices).
               super__Vector_base<S98Player::S98_CHIPDEV,_std::allocator<S98Player::S98_CHIPDEV>_>.
               _M_impl.super__Vector_impl_data._M_start);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&(this->_tagData)._M_t);
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UINT8 S98Player::UnloadFile(void)
{
	if (_playState & PLAYSTATE_PLAY)
		return 0xFF;
	
	_playState = 0x00;
	_dLoad = NULL;
	_fileData = NULL;
	_fileHdr.fileVer = 0xFF;
	_fileHdr.dataOfs = 0x00;
	_devHdrs.clear();
	_devices.clear();
	_tagData.clear();
	
	return 0x00;
}